

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void __thiscall
VectorFormatter<DefaultFormatter>::
Ser<ParamsStream<SizeComputer&,TransactionSerParams>,std::vector<CTxOut,std::allocator<CTxOut>>>
          (VectorFormatter<DefaultFormatter> *this,
          ParamsStream<SizeComputer_&,_TransactionSerParams> *s,
          vector<CTxOut,_std::allocator<CTxOut>_> *v)

{
  long lVar1;
  pointer pCVar2;
  value_type *elem;
  pointer pCVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<ParamsStream<SizeComputer&,TransactionSerParams>>
            (s,((long)(v->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(v->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x3333333333333333);
  pCVar2 = (v->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (pCVar3 = (v->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                super__Vector_impl_data._M_start; pCVar3 != pCVar2; pCVar3 = pCVar3 + 1) {
    s->m_substream->nSize = s->m_substream->nSize + 8;
    SerializeMany<ParamsStream<SizeComputer&,TransactionSerParams>,prevector<28u,unsigned_char,unsigned_int,int>>
              (s,&(pCVar3->scriptPubKey).super_CScriptBase);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }